

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg,char *pass,bool check_all,bool check_relink)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  char *pcVar3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar4;
  string *config;
  pointer this_00;
  bool local_233;
  bool local_232;
  undefined1 local_1d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_commands;
  string local_1b8 [8];
  string doc;
  cmStateDirectory local_190;
  undefined1 local_168 [8];
  string subdir;
  __normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
  local_140;
  __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
  local_138;
  const_iterator ci;
  undefined1 local_118 [8];
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  string tname;
  string local_d8;
  TargetType local_b4;
  cmGeneratorTarget *pcStack_b0;
  int type;
  cmGeneratorTarget *gtarget;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_a0;
  iterator l;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  allocator local_51;
  undefined1 local_50 [8];
  string makeTarget;
  bool check_relink_local;
  bool check_all_local;
  char *pass_local;
  cmLocalUnixMakefileGenerator3 *lg_local;
  ostream *ruleFileStream_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  makeTarget.field_2._M_local_buf[0xe] = check_relink;
  makeTarget.field_2._M_local_buf[0xf] = check_all;
  pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)lg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,pcVar3,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::__cxx11::string::operator+=((string *)local_50,"/");
  std::__cxx11::string::operator+=((string *)local_50,pass);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __x = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)lg);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l,__x);
  local_a0._M_current =
       (cmGeneratorTarget **)
       std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                 ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l);
  do {
    gtarget = (cmGeneratorTarget *)
              std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                        ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l);
    bVar2 = __gnu_cxx::operator!=
                      (&local_a0,
                       (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                        *)&gtarget);
    if (!bVar2) {
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&ci,(cmLocalGenerator *)lg);
      cmStateSnapshot::GetChildren
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_118,
                 (cmStateSnapshot *)&ci);
      local_140._M_current =
           (cmStateSnapshot *)
           std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin
                     ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_118);
      __gnu_cxx::
      __normal_iterator<cmStateSnapshot_const*,std::vector<cmStateSnapshot,std::allocator<cmStateSnapshot>>>
      ::__normal_iterator<cmStateSnapshot*>
                ((__normal_iterator<cmStateSnapshot_const*,std::vector<cmStateSnapshot,std::allocator<cmStateSnapshot>>>
                  *)&local_138,&local_140);
      while( true ) {
        subdir.field_2._8_8_ =
             std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end
                       ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_118);
        bVar2 = __gnu_cxx::operator!=
                          (&local_138,
                           (__normal_iterator<cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                            *)((long)&subdir.field_2 + 8));
        if (!bVar2) break;
        this_00 = __gnu_cxx::
                  __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                  ::operator->(&local_138);
        cmStateSnapshot::GetDirectory(&local_190,this_00);
        pcVar3 = cmStateDirectory::GetCurrentBinary(&local_190);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_168,pcVar3,(allocator *)(doc.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(doc.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator+=((string *)local_168,"/");
        std::__cxx11::string::operator+=((string *)local_168,pass);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&targets.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_168);
        std::__cxx11::string::~string((string *)local_168);
        __gnu_cxx::
        __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
        ::operator++(&local_138);
      }
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&targets.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((bVar2) && (bVar2 = std::operator!=(&this->EmptyRuleHackDepends,""), bVar2)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&targets.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    &this->EmptyRuleHackDepends);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b8,"Convenience name for \"",
                 (allocator *)
                 ((long)&no_commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&no_commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::__cxx11::string::operator+=(local_1b8,pass);
      std::__cxx11::string::operator+=(local_1b8,"\" pass in the directory.");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1d8);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,ruleFileStream,pcVar3,(string *)local_50,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&targets.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1d8,true,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d8);
      std::__cxx11::string::~string(local_1b8);
      std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)local_118);
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&targets.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_50);
      return;
    }
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_a0);
    pcStack_b0 = *ppcVar4;
    local_b4 = cmGeneratorTarget::GetType(pcStack_b0);
    pcVar1 = pcStack_b0;
    if ((((local_b4 == EXECUTABLE) || (local_b4 == STATIC_LIBRARY)) || (local_b4 == SHARED_LIBRARY))
       || (((local_b4 == MODULE_LIBRARY || (local_b4 == OBJECT_LIBRARY)) || (local_b4 == UTILITY))))
    {
      tname.field_2._M_local_buf[0xe] = '\0';
      tname.field_2._M_local_buf[0xd] = '\0';
      if ((makeTarget.field_2._M_local_buf[0xf] & 1U) == 0) {
LAB_0070ddbc:
        pcVar1 = pcStack_b0;
        local_233 = true;
        if ((makeTarget.field_2._M_local_buf[0xe] & 1U) != 0) {
          config = cmLocalCommonGenerator::GetConfigName_abi_cxx11_
                             (&lg->super_cmLocalCommonGenerator);
          local_233 = cmGeneratorTarget::NeedRelinkBeforeInstall(pcVar1,config);
        }
        local_232 = local_233;
      }
      else {
        std::allocator<char>::allocator();
        tname.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string
                  ((string *)&local_d8,"EXCLUDE_FROM_ALL",
                   (allocator *)(tname.field_2._M_local_buf + 0xf));
        tname.field_2._M_local_buf[0xd] = '\x01';
        bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_d8);
        local_232 = false;
        if (!bVar2) goto LAB_0070ddbc;
      }
      if ((tname.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_d8);
      }
      if ((tname.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(tname.field_2._M_local_buf + 0xf));
      }
      if (local_232 != false) {
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  ((string *)
                   &children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,lg,pcStack_b0);
        std::__cxx11::string::operator+=
                  ((string *)
                   &children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,"/");
        std::__cxx11::string::operator+=
                  ((string *)
                   &children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pass);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&targets.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (value_type *)
                    &children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &children.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&local_a0);
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg,
  const char* pass, bool check_all, bool check_relink)
{
  // Get the relative path to the subdirectory from the top.
  std::string makeTarget = lg->GetCurrentBinaryDirectory();
  makeTarget += "/";
  makeTarget += pass;

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  std::vector<cmGeneratorTarget*> targets = lg->GetGeneratorTargets();
  for (std::vector<cmGeneratorTarget*>::iterator l = targets.begin();
       l != targets.end(); ++l) {
    cmGeneratorTarget* gtarget = *l;
    int type = gtarget->GetType();
    if ((type == cmStateEnums::EXECUTABLE) ||
        (type == cmStateEnums::STATIC_LIBRARY) ||
        (type == cmStateEnums::SHARED_LIBRARY) ||
        (type == cmStateEnums::MODULE_LIBRARY) ||
        (type == cmStateEnums::OBJECT_LIBRARY) ||
        (type == cmStateEnums::UTILITY)) {
      // Add this to the list of depends rules in this directory.
      if ((!check_all || !gtarget->GetPropertyAsBool("EXCLUDE_FROM_ALL")) &&
          (!check_relink ||
           gtarget->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
        std::string tname = lg->GetRelativeTargetDirectory(gtarget);
        tname += "/";
        tname += pass;
        depends.push_back(tname);
      }
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  std::vector<cmStateSnapshot> children = lg->GetStateSnapshot().GetChildren();
  for (std::vector<cmStateSnapshot>::const_iterator ci = children.begin();
       ci != children.end(); ++ci) {
    std::string subdir = ci->GetDirectory().GetCurrentBinary();
    subdir += "/";
    subdir += pass;
    depends.push_back(subdir);
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && this->EmptyRuleHackDepends != "") {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc = "Convenience name for \"";
  doc += pass;
  doc += "\" pass in the directory.";
  std::vector<std::string> no_commands;
  lg->WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends,
                    no_commands, true);
}